

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_apply_interpolation.h
# Opt level: O1

void ncnn::gridsample_nearest_apply_interpolation_p16
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  undefined8 *puVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  
  iVar2 = dst->c;
  if (0 < (long)iVar2) {
    iVar7 = dst->h * dst->w * dst->d;
    lVar8 = 0;
    do {
      if (0 < iVar7) {
        sVar3 = src->cstep;
        sVar4 = src->elemsize;
        pvVar5 = src->data;
        pvVar6 = offset_value->data;
        puVar9 = (undefined8 *)(dst->cstep * lVar8 * dst->elemsize + (long)dst->data);
        lVar10 = 0;
        do {
          lVar11 = (long)*(int *)((long)pvVar6 + lVar10 * 4);
          if (lVar11 < 0) {
            uVar13 = 0;
            uVar12 = 0;
            uVar14 = 0;
            uVar15 = 0;
            uVar16 = 0;
            uVar17 = 0;
            uVar18 = 0;
            uVar19 = 0;
          }
          else {
            puVar1 = (undefined8 *)((long)pvVar5 + lVar11 * 4 + sVar3 * lVar8 * sVar4);
            uVar12 = *puVar1;
            uVar13 = puVar1[1];
            uVar14 = puVar1[2];
            uVar15 = puVar1[3];
            uVar16 = puVar1[4];
            uVar17 = puVar1[5];
            uVar18 = puVar1[6];
            uVar19 = puVar1[7];
          }
          *puVar9 = uVar12;
          puVar9[1] = uVar13;
          puVar9[2] = uVar14;
          puVar9[3] = uVar15;
          puVar9[4] = uVar16;
          puVar9[5] = uVar17;
          puVar9[6] = uVar18;
          puVar9[7] = uVar19;
          puVar9 = puVar9 + 8;
          lVar10 = lVar10 + 1;
        } while (iVar7 != (int)lVar10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar2);
  }
  return;
}

Assistant:

static void gridsample_nearest_apply_interpolation_p16(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const int* offset_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            __m512 _v = offset_ptr[0] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[0]) : _mm512_set1_ps(0);
            offset_ptr++;

            _mm512_storeu_ps(dstptr, _v);
            dstptr += 16;
        }
    }
}